

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.cc
# Opt level: O1

int main(void)

{
  _Atomic_word *p_Var1;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  longlong lVar5;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var6;
  Array b;
  QPDFObjectHandle c;
  Array a;
  QPDF pdf;
  QPDF pdf2;
  QPDFObjectHandle d;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [24];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  pair<bool,_QPDFObjectHandle> local_a8;
  Array local_90;
  undefined1 local_78 [8];
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  Sparse *local_50;
  element_type *local_48;
  QPDF local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_allocated_capacity = 0;
  QPDF_Array::QPDF_Array
            ((QPDF_Array *)local_e8,
             (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_c8,true);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f0aa0;
  this[1]._vptr__Sp_counted_base = (_func_int **)local_e8;
  local_e8 = (undefined1  [8])0x0;
  this[1]._M_use_count = auStack_e0._0_4_;
  this[1]._M_weak_count = auStack_e0._4_4_;
  this[2]._vptr__Sp_counted_base = (_func_int **)auStack_e0._8_8_;
  this[2]._M_use_count = auStack_e0._16_4_;
  this[2]._M_weak_count = auStack_e0._20_4_;
  auStack_e0._16_8_ = (pointer)0x0;
  auStack_e0._0_8_ = (element_type *)0x0;
  auStack_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined1 *)&this[4]._vptr__Sp_counted_base = 8;
  this[4]._M_use_count = 0;
  this[4]._M_weak_count = 0;
  this[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[5]._M_use_count = 0;
  this[5]._M_weak_count = 0;
  this[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[6]._M_use_count = -1;
  this[6]._M_weak_count = -1;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)auStack_e0);
  std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
            ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)local_e8);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_c8);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_90.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                    )0x0;
  local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this + 1);
  local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this;
  iVar4 = qpdf::Array::size(&local_90);
  if (iVar4 != 0) {
    __assert_fail("a.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                  ,0xf,"int main()");
  }
  _Var2._M_head_impl = (Sparse *)(auStack_e0 + 8);
  local_e8 = (undefined1  [8])_Var2._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"1","");
  local_c8._0_8_ = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  QPDFObjectHandle::parse((QPDFObjectHandle *)&local_a8,(string *)local_e8,(string *)local_c8);
  qpdf::Array::push_back(&local_90,(QPDFObjectHandle *)&local_a8);
  if (local_a8.second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
  }
  if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
    operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
  }
  local_e8 = (undefined1  [8])_Var2._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"(potato)","");
  local_c8._0_8_ = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  QPDFObjectHandle::parse((QPDFObjectHandle *)&local_a8,(string *)local_e8,(string *)local_c8);
  qpdf::Array::push_back(&local_90,(QPDFObjectHandle *)&local_a8);
  if (local_a8.second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
  }
  if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
    operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
  }
  local_e8 = (undefined1  [8])_Var2._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"null","");
  local_c8._0_8_ = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  QPDFObjectHandle::parse((QPDFObjectHandle *)&local_a8,(string *)local_e8,(string *)local_c8);
  qpdf::Array::push_back(&local_90,(QPDFObjectHandle *)&local_a8);
  if (local_a8.second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
  }
  if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
    operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
  }
  local_e8 = (undefined1  [8])_Var2._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"null","");
  local_c8._0_8_ = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  QPDFObjectHandle::parse((QPDFObjectHandle *)&local_a8,(string *)local_e8,(string *)local_c8);
  qpdf::Array::push_back(&local_90,(QPDFObjectHandle *)&local_a8);
  if (local_a8.second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
  }
  if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
    operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
  }
  local_e8 = (undefined1  [8])_Var2._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"/Quack","");
  local_c8._0_8_ = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  QPDFObjectHandle::parse((QPDFObjectHandle *)&local_a8,(string *)local_e8,(string *)local_c8);
  qpdf::Array::push_back(&local_90,(QPDFObjectHandle *)&local_a8);
  if (local_a8.second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
  }
  if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
    operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
  }
  iVar4 = qpdf::Array::size(&local_90);
  if (iVar4 != 5) {
    __assert_fail("a.size() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                  ,0x16,"int main()");
  }
  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_e8,&local_90,0);
  bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)auStack_e0);
  if (bVar3) {
    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90,0);
    lVar5 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)(local_c8 + 8));
    if (lVar5 == 1) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_allocated_capacity);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0._8_8_);
      }
      qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90,1);
      bVar3 = QPDFObjectHandle::isString((QPDFObjectHandle *)(local_c8 + 8));
      if (bVar3) {
        qpdf::Array::at(&local_a8,&local_90,1);
        QPDFObjectHandle::getStringValue_abi_cxx11_((string *)local_e8,&local_a8.second);
        iVar4 = std::__cxx11::string::compare(local_e8);
        if (iVar4 == 0) {
          if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
            operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
          }
          if (local_a8.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.second.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_allocated_capacity !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_b8._M_allocated_capacity);
          }
          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_e8,&local_90,2);
          bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)auStack_e0);
          if (!bVar3) {
            __assert_fail("a.at(2).second.isNull()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                          ,0x19,"int main()");
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0._8_8_);
          }
          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_e8,&local_90,3);
          bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)auStack_e0);
          if (!bVar3) {
            __assert_fail("a.at(3).second.isNull()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                          ,0x1a,"int main()");
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0._8_8_);
          }
          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90,4);
          bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_c8 + 8));
          if (bVar3) {
            qpdf::Array::at(&local_a8,&local_90,4);
            QPDFObjectHandle::getName_abi_cxx11_((string *)local_e8,&local_a8.second);
            iVar4 = std::__cxx11::string::compare(local_e8);
            if (iVar4 == 0) {
              if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
              }
              if (local_a8.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_a8.second.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_allocated_capacity !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_b8._M_allocated_capacity);
              }
              local_e8 = (undefined1  [8])_Var2._M_head_impl;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"/BeforeQuack","");
              local_c8._0_8_ = &local_b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
              QPDFObjectHandle::parse
                        ((QPDFObjectHandle *)&local_a8,(string *)local_e8,(string *)local_c8);
              qpdf::Array::insert(&local_90,4,(QPDFObjectHandle *)&local_a8);
              if (local_a8.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a8.second.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._0_8_ != &local_b8) {
                operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
              }
              if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
              }
              iVar4 = qpdf::Array::size(&local_90);
              if (iVar4 != 6) {
                __assert_fail("a.size() == 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                              ,0x1e,"int main()");
              }
              qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_e8,&local_90,0);
              bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)auStack_e0);
              if (bVar3) {
                qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90,0);
                lVar5 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)(local_c8 + 8));
                if (lVar5 == 1) {
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_allocated_capacity
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_b8._M_allocated_capacity);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0._8_8_);
                  }
                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90,4);
                  bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_c8 + 8));
                  if (bVar3) {
                    qpdf::Array::at(&local_a8,&local_90,4);
                    QPDFObjectHandle::getName_abi_cxx11_((string *)local_e8,&local_a8.second);
                    iVar4 = std::__cxx11::string::compare(local_e8);
                    if (iVar4 == 0) {
                      if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                        operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
                      }
                      if (local_a8.second.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_a8.second.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
                      }
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_b8._M_allocated_capacity !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_b8._M_allocated_capacity);
                      }
                      qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90,5);
                      bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_c8 + 8));
                      if (bVar3) {
                        qpdf::Array::at(&local_a8,&local_90,5);
                        QPDFObjectHandle::getName_abi_cxx11_((string *)local_e8,&local_a8.second);
                        iVar4 = std::__cxx11::string::compare(local_e8);
                        if (iVar4 == 0) {
                          if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                            operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
                          }
                          if (local_a8.second.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_a8.second.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi);
                          }
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              local_b8._M_allocated_capacity !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_b8._M_allocated_capacity);
                          }
                          local_e8 = (undefined1  [8])_Var2._M_head_impl;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_e8,"/Third","");
                          local_c8._0_8_ = &local_b8;
                          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
                          QPDFObjectHandle::parse
                                    ((QPDFObjectHandle *)&local_a8,(string *)local_e8,
                                     (string *)local_c8);
                          qpdf::Array::insert(&local_90,2,(QPDFObjectHandle *)&local_a8);
                          if (local_a8.second.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                              (element_type *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_a8.second.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_c8._0_8_ != &local_b8) {
                            operator_delete((void *)local_c8._0_8_,
                                            (ulong)(local_b8._M_allocated_capacity + 1));
                          }
                          if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                            operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
                          }
                          iVar4 = qpdf::Array::size(&local_90);
                          if (iVar4 != 7) {
                            __assert_fail("a.size() == 7",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                          ,0x24,"int main()");
                          }
                          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90,1);
                          bVar3 = QPDFObjectHandle::isString((QPDFObjectHandle *)(local_c8 + 8));
                          if (bVar3) {
                            qpdf::Array::at(&local_a8,&local_90,1);
                            QPDFObjectHandle::getStringValue_abi_cxx11_
                                      ((string *)local_e8,&local_a8.second);
                            iVar4 = std::__cxx11::string::compare(local_e8);
                            if (iVar4 == 0) {
                              if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                                operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
                              }
                              if (local_a8.second.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_a8.second.super_BaseHandle.obj.
                                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  local_b8._M_allocated_capacity !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           local_b8._M_allocated_capacity);
                              }
                              qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90,2);
                              bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_c8 + 8));
                              if (bVar3) {
                                qpdf::Array::at(&local_a8,&local_90,2);
                                QPDFObjectHandle::getName_abi_cxx11_
                                          ((string *)local_e8,&local_a8.second);
                                iVar4 = std::__cxx11::string::compare(local_e8);
                                if (iVar4 == 0) {
                                  if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                                    operator_delete((void *)local_e8,(ulong)(auStack_e0._8_8_ + 1));
                                  }
                                  if (local_a8.second.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_a8.second.super_BaseHandle.obj.
                                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
                                  }
                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      local_b8._M_allocated_capacity !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                               local_b8._M_allocated_capacity);
                                  }
                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_e8,&local_90
                                                  ,3);
                                  bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)auStack_e0);
                                  if (!bVar3) {
                                    __assert_fail("a.at(3).second.isNull()",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x27,"int main()");
                                  }
                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      auStack_e0._8_8_ !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                               auStack_e0._8_8_);
                                  }
                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,&local_90
                                                  ,6);
                                  bVar3 = QPDFObjectHandle::isName
                                                    ((QPDFObjectHandle *)(local_c8 + 8));
                                  if (bVar3) {
                                    qpdf::Array::at(&local_a8,&local_90,6);
                                    QPDFObjectHandle::getName_abi_cxx11_
                                              ((string *)local_e8,&local_a8.second);
                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                    if (iVar4 == 0) {
                                      if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                                        operator_delete((void *)local_e8,
                                                        (ulong)(auStack_e0._8_8_ + 1));
                                      }
                                      if (local_a8.second.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                      
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                      }
                                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          local_b8._M_allocated_capacity !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   local_b8._M_allocated_capacity);
                                      }
                                      local_e8 = (undefined1  [8])_Var2._M_head_impl;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_e8,"/First","");
                                      local_c8._0_8_ = &local_b8;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_c8,"");
                                      QPDFObjectHandle::parse
                                                ((QPDFObjectHandle *)&local_a8,(string *)local_e8,
                                                 (string *)local_c8);
                                      qpdf::Array::insert(&local_90,0,(QPDFObjectHandle *)&local_a8)
                                      ;
                                      if (local_a8.second.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr != (element_type *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   local_a8.second.super_BaseHandle.obj.
                                                                                                      
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_c8._0_8_ != &local_b8) {
                                        operator_delete((void *)local_c8._0_8_,
                                                        (ulong)(local_b8._M_allocated_capacity + 1))
                                        ;
                                      }
                                      if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                                        operator_delete((void *)local_e8,
                                                        (ulong)(auStack_e0._8_8_ + 1));
                                      }
                                      iVar4 = qpdf::Array::size(&local_90);
                                      if (iVar4 != 8) {
                                        __assert_fail("a.size() == 8",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x2b,"int main()");
                                      }
                                      qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8,
                                                      &local_90,0);
                                      bVar3 = QPDFObjectHandle::isName
                                                        ((QPDFObjectHandle *)(local_c8 + 8));
                                      if (bVar3) {
                                        qpdf::Array::at(&local_a8,&local_90,0);
                                        QPDFObjectHandle::getName_abi_cxx11_
                                                  ((string *)local_e8,&local_a8.second);
                                        iVar4 = std::__cxx11::string::compare(local_e8);
                                        if (iVar4 == 0) {
                                          if (local_e8 != (undefined1  [8])_Var2._M_head_impl) {
                                            operator_delete((void *)local_e8,
                                                            (ulong)(auStack_e0._8_8_ + 1));
                                          }
                                          if (local_a8.second.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi !=
                                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                              
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                          }
                                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                              local_b8._M_allocated_capacity !=
                                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)local_b8._M_allocated_capacity);
                                          }
                                          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_e8,
                                                          &local_90,1);
                                          bVar3 = QPDFObjectHandle::isInteger
                                                            ((QPDFObjectHandle *)auStack_e0);
                                          if (bVar3) {
                                            qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_c8
                                                            ,&local_90,1);
                                            lVar5 = QPDFObjectHandle::getIntValue
                                                              ((QPDFObjectHandle *)(local_c8 + 8));
                                            if (lVar5 == 1) {
                                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                              }
                                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_ !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                              }
                                              qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                              local_c8,&local_90,7);
                                              bVar3 = QPDFObjectHandle::isName
                                                                ((QPDFObjectHandle *)(local_c8 + 8))
                                              ;
                                              if (bVar3) {
                                                qpdf::Array::at(&local_a8,&local_90,7);
                                                QPDFObjectHandle::getName_abi_cxx11_
                                                          ((string *)local_e8,&local_a8.second);
                                                iVar4 = std::__cxx11::string::compare(local_e8);
                                                if (iVar4 == 0) {
                                                  if (local_e8 !=
                                                      (undefined1  [8])_Var2._M_head_impl) {
                                                    operator_delete((void *)local_e8,
                                                                    (ulong)(auStack_e0._8_8_ + 1));
                                                  }
                                                  if (local_a8.second.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::erase(&local_90,6);
                                                  iVar4 = qpdf::Array::size(&local_90);
                                                  if (iVar4 != 7) {
                                                    __assert_fail("a.size() == 7",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x31,"int main()");
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,0);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,1);
                                                  bVar3 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (bVar3) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    local_c8,&local_90,1);
                                                    lVar5 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       (local_c8 + 8));
                                                    if (lVar5 == 1) {
                                                      if ((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,5);
                                                  bVar3 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (!bVar3) {
                                                    __assert_fail("a.at(5).second.isNull()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x34,"int main()");
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,6);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,6);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::erase(&local_90,6);
                                                  iVar4 = qpdf::Array::size(&local_90);
                                                  if (iVar4 != 6) {
                                                    __assert_fail("a.size() == 6",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x38,"int main()");
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,0);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,1);
                                                  bVar3 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (bVar3) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    local_c8,&local_90,1);
                                                    lVar5 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       (local_c8 + 8));
                                                    if (lVar5 == 1) {
                                                      if ((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,3);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,3);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,4);
                                                  bVar3 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (!bVar3) {
                                                    __assert_fail("a.at(4).second.isNull()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x3c,"int main()");
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,5);
                                                  bVar3 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (!bVar3) {
                                                    __assert_fail("a.at(5).second.isNull()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x3d,"int main()");
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  local_e8 = (undefined1  [8])_Var2._M_head_impl;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_e8,"12","");
                                                  local_c8._0_8_ = &local_b8;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_c8,"");
                                                  QPDFObjectHandle::parse
                                                            ((QPDFObjectHandle *)&local_a8,
                                                             (string *)local_e8,(string *)local_c8);
                                                  qpdf::Array::setAt(&local_90,4,
                                                                     (QPDFObjectHandle *)&local_a8);
                                                  if (local_a8.second.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr != (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_a8.second.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_c8._0_8_ != &local_b8) {
                                                    operator_delete((void *)local_c8._0_8_,
                                                                    (ulong)(local_b8.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  if (local_e8 !=
                                                      (undefined1  [8])_Var2._M_head_impl) {
                                                    operator_delete((void *)local_e8,
                                                                    (ulong)(auStack_e0._8_8_ + 1));
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,4);
                                                  bVar3 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (bVar3) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    local_c8,&local_90,4);
                                                    lVar5 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       (local_c8 + 8));
                                                    if (lVar5 == 0xc) {
                                                      if ((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  QPDFObjectHandle::newNull();
                                                  qpdf::Array::setAt(&local_90,4,
                                                                     (QPDFObjectHandle *)local_e8);
                                                  if ((element_type *)auStack_e0._0_8_ !=
                                                      (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._0_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,4);
                                                  bVar3 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (!bVar3) {
                                                    __assert_fail("a.at(4).second.isNull()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x42,"int main()");
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  iVar4 = qpdf::Array::size(&local_90);
                                                  qpdf::Array::erase(&local_90,iVar4 + -1);
                                                  iVar4 = qpdf::Array::size(&local_90);
                                                  if (iVar4 != 5) {
                                                    __assert_fail("a.size() == 5",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x45,"int main()");
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,0);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,1);
                                                  bVar3 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (bVar3) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    local_c8,&local_90,1);
                                                    lVar5 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       (local_c8 + 8));
                                                    if (lVar5 == 1) {
                                                      if ((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,3);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,3);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,4);
                                                  bVar3 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (!bVar3) {
                                                    __assert_fail("a.at(4).second.isNull()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x49,"int main()");
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  iVar4 = qpdf::Array::size(&local_90);
                                                  qpdf::Array::erase(&local_90,iVar4 + -1);
                                                  iVar4 = qpdf::Array::size(&local_90);
                                                  if (iVar4 != 4) {
                                                    __assert_fail("a.size() == 4",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x4c,"int main()");
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,0);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,1);
                                                  bVar3 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (bVar3) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    local_c8,&local_90,1);
                                                    lVar5 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       (local_c8 + 8));
                                                    if (lVar5 == 1) {
                                                      if ((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,3);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,3);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  iVar4 = qpdf::Array::size(&local_90);
                                                  qpdf::Array::erase(&local_90,iVar4 + -1);
                                                  iVar4 = qpdf::Array::size(&local_90);
                                                  if (iVar4 != 3) {
                                                    __assert_fail("a.size() == 3",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x52,"int main()");
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,0);
                                                  bVar3 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,&local_90,1);
                                                  bVar3 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (bVar3) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    local_c8,&local_90,1);
                                                    lVar5 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       (local_c8 + 8));
                                                    if (lVar5 == 1) {
                                                      if ((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_c8,&local_90,2);
                                                  bVar3 = QPDFObjectHandle::isString
                                                                    ((QPDFObjectHandle *)
                                                                     (local_c8 + 8));
                                                  if (bVar3) {
                                                    qpdf::Array::at(&local_a8,&local_90,2);
                                                    QPDFObjectHandle::getStringValue_abi_cxx11_
                                                              ((string *)local_e8,&local_a8.second);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      if (local_a8.second.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_a8.second.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)local_b8._M_allocated_capacity !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_b8._M_allocated_capacity);
                                                  }
                                                  QPDF::QPDF((QPDF *)local_78);
                                                  QPDF::emptyPDF((QPDF *)local_78);
                                                  operator____qpdf((char *)&local_60,0x281861);
                                                  if (local_60.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    if (__libc_single_threaded == '\0') {
                                                      LOCK();
                                                      (local_60.super_BaseHandle.obj.
                                                                                                              
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count =
                                                       (local_60.super_BaseHandle.obj.
                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                                  UNLOCK();
                                                  }
                                                  else {
                                                    (local_60.super_BaseHandle.obj.
                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count =
                                                       (local_60.super_BaseHandle.obj.
                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                                  }
                                                  }
                                                  local_a8._0_8_ =
                                                       local_60.super_BaseHandle.obj.
                                                                                                              
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  local_a8.second.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)
                                                            local_60.super_BaseHandle.obj.
                                                                                                                        
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                                  std::
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  ::vector((
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  *)local_c8,10,(value_type *)&local_a8,
                                                  (allocator_type *)&local_70);
                                                  QPDF_Array::QPDF_Array
                                                            ((QPDF_Array *)local_e8,
                                                             (
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  *)local_c8,true);
                                                  this_00 = (element_type *)operator_new(0x70);
                                                  *(undefined8 *)
                                                   ((long)&(this_00->value).
                                                                                                                      
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8) = 0x100000001;
                                                  *(undefined ***)
                                                   &(this_00->value).
                                                                                                        
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                       = &PTR___Sp_counted_ptr_inplace_002f0aa0;
                                                  ((
                                                  __uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                                                  *)((long)&(this_00->value).
                                                                                                                        
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 0x10))->_M_t =
                                                       (
                                                  tuple<QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                                                  )local_e8;
                                                  local_e8 = (undefined1  [8])0x0;
                                                  *(undefined8 *)
                                                   ((long)&(this_00->value).
                                                                                                                      
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 0x18) = auStack_e0._0_8_;
                                                  *(undefined8 *)
                                                   ((long)&(this_00->value).
                                                                                                                      
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 0x20) = auStack_e0._8_8_;
                                                  *(undefined8 *)
                                                   ((long)&(this_00->value).
                                                                                                                      
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 0x28) = auStack_e0._16_8_;
                                                  auStack_e0._16_8_ = (pointer)0x0;
                                                  auStack_e0._0_8_ = (element_type *)0x0;
                                                  auStack_e0._8_8_ =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x0;
                                                  *(undefined1 *)
                                                   &(this_00->object_description).
                                                                                                        
                                                  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi = 8;
                                                  this_00->qpdf = (QPDF *)0x0;
                                                  (this_00->og).obj = 0;
                                                  (this_00->og).gen = 0;
                                                  this_00->parsed_offset = 0;
                                                  *(_func_int ***)
                                                   &this_00[1].value.
                                                                                                        
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                       = (_func_int **)0x0;
                                                  *(undefined8 *)
                                                   ((long)&this_00[1].value.
                                                                                                                      
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8) = 0xffffffffffffffff;
                                                  std::
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  ::~vector((
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  *)auStack_e0);
                                                  std::
                                                  unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                                                  *)local_e8);
                                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                  ::_M_release(this);
                                                  std::
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  ::~vector((
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  *)local_c8);
                                                  if (local_a8.second.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr != (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_a8.second.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                                                  }
                                                  _Var6._M_head_impl =
                                                       (Sparse *)
                                                       ((long)&(this_00->value).
                                                                                                                              
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 0x10);
                                                  if (local_60.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_60.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (__libc_single_threaded == '\0') {
                                                    LOCK();
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  UNLOCK();
                                                  }
                                                  else {
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  }
                                                  local_b8._M_allocated_capacity = 0;
                                                  local_c8._0_8_ = _Var6;
                                                  local_c8._8_8_ = this_00;
                                                  QPDF::newIndirectNull((QPDF *)local_e8);
                                                  qpdf::Array::setAt((Array *)local_c8,5,
                                                                     (QPDFObjectHandle *)local_e8);
                                                  if ((element_type *)auStack_e0._0_8_ !=
                                                      (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._0_8_);
                                                  }
                                                  operator____qpdf(local_e8,0x2634d4);
                                                  qpdf::Array::setAt((Array *)local_c8,7,
                                                                     (QPDFObjectHandle *)local_e8);
                                                  if ((element_type *)auStack_e0._0_8_ !=
                                                      (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._0_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,(Array *)local_c8,3);
                                                  bVar3 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (!bVar3) {
                                                    __assert_fail("b.at(3).second.isNull()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x5f,"int main()");
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,(Array *)local_c8,8);
                                                  bVar3 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (!bVar3) {
                                                    __assert_fail("b.at(8).second.isNull()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x60,"int main()");
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,(Array *)local_c8,5);
                                                  bVar3 = QPDFObjectHandle::isIndirect
                                                                    ((QPDFObjectHandle *)auStack_e0)
                                                  ;
                                                  if (!bVar3) {
                                                    __assert_fail("b.at(5).second.isIndirect()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x61,"int main()");
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  if (__libc_single_threaded == '\0') {
                                                    LOCK();
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  UNLOCK();
                                                  }
                                                  else {
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  }
                                                  local_a8._0_8_ = _Var6;
                                                  local_a8.second.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = this_00;
                                                  QPDFObjectHandle::unparse_abi_cxx11_
                                                            ((string *)local_e8,
                                                             (QPDFObjectHandle *)&local_a8);
                                                  iVar4 = std::__cxx11::string::compare(local_e8);
                                                  if (iVar4 == 0) {
                                                    if (local_e8 !=
                                                        (undefined1  [8])_Var2._M_head_impl) {
                                                      operator_delete((void *)local_e8,
                                                                      (ulong)(auStack_e0._8_8_ + 1))
                                                      ;
                                                    }
                                                    if (local_a8.second.super_BaseHandle.obj.
                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr != (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_a8.second.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                                                  }
                                                  if (__libc_single_threaded == '\0') {
                                                    LOCK();
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  UNLOCK();
                                                  }
                                                  else {
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  }
                                                  local_e8 = (undefined1  [8])_Var6;
                                                  auStack_e0._0_8_ = this_00;
                                                  QPDFObjectHandle::unsafeShallowCopy
                                                            ((QPDFObjectHandle *)&local_a8);
                                                  if ((element_type *)auStack_e0._0_8_ !=
                                                      (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._0_8_);
                                                  }
                                                  if (__libc_single_threaded == '\0') {
                                                    LOCK();
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  UNLOCK();
                                                  }
                                                  else {
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  }
                                                  local_e8 = (undefined1  [8])_Var6;
                                                  auStack_e0._0_8_ = this_00;
                                                  QPDFObjectHandle::shallowCopy(&local_60);
                                                  if ((element_type *)auStack_e0._0_8_ !=
                                                      (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._0_8_);
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_e8,(Array *)local_c8,7);
                                                  operator____qpdf((char *)&local_70,0x2635cb);
                                                  QPDFObjectHandle::setArrayItem
                                                            ((QPDFObjectHandle *)auStack_e0,2,
                                                             &local_70);
                                                  if (local_70.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_70.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)auStack_e0._8_8_ !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._8_8_);
                                                  }
                                                  QPDFObjectHandle::unparse_abi_cxx11_
                                                            ((string *)local_e8,
                                                             (QPDFObjectHandle *)&local_a8);
                                                  iVar4 = std::__cxx11::string::compare(local_e8);
                                                  if (iVar4 == 0) {
                                                    if (local_e8 !=
                                                        (undefined1  [8])_Var2._M_head_impl) {
                                                      operator_delete((void *)local_e8,
                                                                      (ulong)(auStack_e0._8_8_ + 1))
                                                      ;
                                                    }
                                                    QPDFObjectHandle::unparse_abi_cxx11_
                                                              ((string *)local_e8,&local_60);
                                                    iVar4 = std::__cxx11::string::compare(local_e8);
                                                    if (iVar4 == 0) {
                                                      if (local_e8 !=
                                                          (undefined1  [8])_Var2._M_head_impl) {
                                                        operator_delete((void *)local_e8,
                                                                        (ulong)(auStack_e0._8_8_ + 1
                                                                               ));
                                                      }
                                                      local_e8 = (undefined1  [8])0x0;
                                                      auStack_e0._0_8_ = (element_type *)0x0;
                                                      qpdf::Array::setAt((Array *)local_c8,3,
                                                                         (QPDFObjectHandle *)
                                                                         local_e8);
                                                      if ((element_type *)auStack_e0._0_8_ !=
                                                          (element_type *)0x0) {
                                                        std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._0_8_);
                                                  }
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "inserted uninitialized object\n",0x1e)
                                                  ;
                                                  QPDF::QPDF((QPDF *)&local_70);
                                                  QPDF::emptyPDF((QPDF *)&local_70);
                                                  if (__libc_single_threaded == '\0') {
                                                    LOCK();
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  UNLOCK();
                                                  }
                                                  else {
                                                    p_Var1 = (_Atomic_word *)
                                                             ((long)&(this_00->value).
                                                                                                                                          
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  + 8);
                                                  *p_Var1 = *p_Var1 + 1;
                                                  }
                                                  local_50 = (Sparse *)_Var6;
                                                  local_48 = this_00;
                                                  QPDF::makeIndirectObject
                                                            (&local_40,(QPDFObjectHandle *)local_78)
                                                  ;
                                                  if (local_38 !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_38);
                                                  }
                                                  if (local_48 != (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_48);
                                                  }
                                                  QPDF::getObject((QPDF *)local_e8,(int)&local_70,1)
                                                  ;
                                                  qpdf::Array::setAt((Array *)local_c8,3,
                                                                     (QPDFObjectHandle *)local_e8);
                                                  if ((element_type *)auStack_e0._0_8_ !=
                                                      (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  auStack_e0._0_8_);
                                                  }
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "inserted uninitialized object\n",0x1e)
                                                  ;
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "sparse array tests done",0x17);
                                                  std::ios::widen((char)*(undefined8 *)
                                                                         (std::cout + -0x18) + -0x80
                                                                 );
                                                  std::ostream::put(-0x80);
                                                  std::ostream::flush();
                                                  QPDF::~QPDF((QPDF *)&local_70);
                                                  if (local_60.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_60.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (local_a8.second.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr != (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_a8.second.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                                                  }
                                                  std::
                                                  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                                                  *)&local_b8._M_allocated_capacity);
                                                  if ((element_type *)local_c8._8_8_ !=
                                                      (element_type *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_c8._8_8_);
                                                  }
                                                  QPDF::~QPDF((QPDF *)local_78);
                                                  std::
                                                  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                                                  ::~unique_ptr(&local_90.sp_elements);
                                                  if (local_90.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(local_90.super_BaseHandle.obj.
                                                                                                                          
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                  ::_M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  this_00);
                                                  return 0;
                                                  }
                                                  __assert_fail(
                                                  "d.unparse() == \"[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x69,"int main()");
                                                  }
                                                  __assert_fail(
                                                  "c.unparse() == \"[ null null null null null 3 0 R null [ 0 1 42 3 ] null null ]\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x68,"int main()");
                                                  }
                                                  __assert_fail(
                                                  "QPDFObjectHandle(obj).unparse() == \"[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,100,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(2).second.isString() && (a.at(2).second.getStringValue() == \"potato\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x55,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x54,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x53,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x4f,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x4e,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x4d,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x48,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x47,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x46,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(4).second.isInteger() && (a.at(4).second.getIntValue() == 12)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x40,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x3b,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x3a,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x39,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(6).second.isName() && (a.at(6).second.getName() == \"/Quack\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x35,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x33,"int main()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x32,"int main()");
                                                }
                                              }
                                              __assert_fail(
                                                  "a.at(7).second.isName() && (a.at(7).second.getName() == \"/Quack\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x2e,"int main()");
                                            }
                                          }
                                          __assert_fail(
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x2d,"int main()");
                                        }
                                      }
                                      __assert_fail(
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                  ,0x2c,"int main()");
                                    }
                                  }
                                  __assert_fail("a.at(6).second.isName() && (a.at(6).second.getName() == \"/Quack\")"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                                ,0x28,"int main()");
                                }
                              }
                              __assert_fail("a.at(2).second.isName() && (a.at(2).second.getName() == \"/Third\")"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                            ,0x26,"int main()");
                            }
                          }
                          __assert_fail("a.at(1).second.isString() && (a.at(1).second.getStringValue() == \"potato\")"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                        ,0x25,"int main()");
                        }
                      }
                      __assert_fail("a.at(5).second.isName() && (a.at(5).second.getName() == \"/Quack\")"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                    ,0x21,"int main()");
                    }
                  }
                  __assert_fail("a.at(4).second.isName() && (a.at(4).second.getName() == \"/BeforeQuack\")"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                                ,0x20,"int main()");
                }
              }
              __assert_fail("a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                            ,0x1f,"int main()");
            }
          }
          __assert_fail("a.at(4).second.isName() && (a.at(4).second.getName() == \"/Quack\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                        ,0x1b,"int main()");
        }
      }
      __assert_fail("a.at(1).second.isString() && (a.at(1).second.getStringValue() == \"potato\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                    ,0x18,"int main()");
    }
  }
  __assert_fail("a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/sparse_array.cc"
                ,0x17,"int main()");
}

Assistant:

int
main()
{
    auto obj = QPDFObject::create<QPDF_Array>(std::vector<QPDFObjectHandle>(), true);
    auto a = qpdf::Array(obj);

    assert(a.size() == 0);

    a.push_back(QPDFObjectHandle::parse("1"));
    a.push_back(QPDFObjectHandle::parse("(potato)"));
    a.push_back(QPDFObjectHandle::parse("null"));
    a.push_back(QPDFObjectHandle::parse("null"));
    a.push_back(QPDFObjectHandle::parse("/Quack"));
    assert(a.size() == 5);
    assert(a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1));
    assert(a.at(1).second.isString() && (a.at(1).second.getStringValue() == "potato"));
    assert(a.at(2).second.isNull());
    assert(a.at(3).second.isNull());
    assert(a.at(4).second.isName() && (a.at(4).second.getName() == "/Quack"));

    a.insert(4, QPDFObjectHandle::parse("/BeforeQuack"));
    assert(a.size() == 6);
    assert(a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1));
    assert(a.at(4).second.isName() && (a.at(4).second.getName() == "/BeforeQuack"));
    assert(a.at(5).second.isName() && (a.at(5).second.getName() == "/Quack"));

    a.insert(2, QPDFObjectHandle::parse("/Third"));
    assert(a.size() == 7);
    assert(a.at(1).second.isString() && (a.at(1).second.getStringValue() == "potato"));
    assert(a.at(2).second.isName() && (a.at(2).second.getName() == "/Third"));
    assert(a.at(3).second.isNull());
    assert(a.at(6).second.isName() && (a.at(6).second.getName() == "/Quack"));

    a.insert(0, QPDFObjectHandle::parse("/First"));
    assert(a.size() == 8);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(7).second.isName() && (a.at(7).second.getName() == "/Quack"));

    a.erase(6);
    assert(a.size() == 7);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(5).second.isNull());
    assert(a.at(6).second.isName() && (a.at(6).second.getName() == "/Quack"));

    a.erase(6);
    assert(a.size() == 6);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));
    assert(a.at(4).second.isNull());
    assert(a.at(5).second.isNull());

    a.setAt(4, QPDFObjectHandle::parse("12"));
    assert(a.at(4).second.isInteger() && (a.at(4).second.getIntValue() == 12));
    a.setAt(4, QPDFObjectHandle::newNull());
    assert(a.at(4).second.isNull());

    a.erase(a.size() - 1);
    assert(a.size() == 5);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));
    assert(a.at(4).second.isNull());

    a.erase(a.size() - 1);
    assert(a.size() == 4);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));

    a.erase(a.size() - 1);
    assert(a.size() == 3);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(2).second.isString() && (a.at(2).second.getStringValue() == "potato"));

    QPDF pdf;
    pdf.emptyPDF();

    obj = QPDFObject::create<QPDF_Array>(
        std::vector<QPDFObjectHandle>{10, "null"_qpdf.getObj()}, true);
    auto b = qpdf::Array(obj);
    b.setAt(5, pdf.newIndirectNull());
    b.setAt(7, "[0 1 2 3]"_qpdf);
    assert(b.at(3).second.isNull());
    assert(b.at(8).second.isNull());
    assert(b.at(5).second.isIndirect());
    assert(
        QPDFObjectHandle(obj).unparse() ==
        "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]");
    auto c = QPDFObjectHandle(obj).unsafeShallowCopy();
    auto d = QPDFObjectHandle(obj).shallowCopy();
    b.at(7).second.setArrayItem(2, "42"_qpdf);
    assert(c.unparse() == "[ null null null null null 3 0 R null [ 0 1 42 3 ] null null ]");
    assert(d.unparse() == "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]");

    try {
        b.setAt(3, {});
        std::cout << "inserted uninitialized object\n";
    } catch (std::logic_error&) {
    }
    QPDF pdf2;
    pdf2.emptyPDF();
    try {
        pdf.makeIndirectObject(obj);
        b.setAt(3, pdf2.getObject(1, 0));
        std::cout << "inserted uninitialized object\n";
    } catch (std::logic_error&) {
    }

    std::cout << "sparse array tests done" << std::endl;
    return 0;
}